

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

void envydis(disisa *isa,FILE *out,uint8_t *code,uint32_t start,int num,int vartype,int ptype,
            int quiet,label *labels,int labelsnum)

{
  label *plVar1;
  ulong *puVar2;
  ulong uVar3;
  uint8_t *puVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  char **ppcVar8;
  long lVar9;
  byte *pbVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  char *__format;
  expr *expr;
  int iVar17;
  size_t __nmemb;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  long local_118;
  ull a [2];
  ull m [2];
  disctx local_c8;
  uint8_t *local_40;
  ulong local_38;
  
  local_c8.atomsnum = 0;
  local_c8.atomsmax = 0;
  local_c8._120_8_ = 0;
  local_c8.labelsnum = 0;
  local_c8.labelsmax = 0;
  local_c8.atoms = (expr **)0x0;
  local_c8.line = (line *)0x0;
  local_c8.labels = (label *)0x0;
  local_c8.oplen = 0;
  local_c8.pos = 0;
  local_c8.reverse = 0;
  local_c8._76_4_ = 0;
  local_c8.codebase = 0;
  local_c8.codesz = 0;
  local_c8.vartype = 0;
  local_c8.ptype = 0;
  local_c8.marks = (int *)0x0;
  local_c8.names = (char **)0x0;
  local_c8.code32 = (uint32_t *)0x0;
  local_c8.code64 = (uint64_t *)0x0;
  local_c8.cur_global_label = (char *)0x0;
  __nmemb = (size_t)((isa->posunit + num + -1) / isa->posunit);
  local_c8.code8 = code;
  local_c8.marks = (int *)calloc(__nmemb,4);
  local_c8.names = (char **)calloc(__nmemb,8);
  local_c8.codesz = num;
  local_c8.codebase = start;
  local_c8.ptype = ptype;
  local_c8.vartype = vartype;
  local_c8.isa = isa;
  local_c8.labels = labels;
  local_c8.labelsnum = labelsnum;
  if (labels != (label *)0x0) {
    uVar20 = 0;
    uVar18 = (ulong)(uint)labelsnum;
    if (labelsnum < 1) {
      uVar18 = uVar20;
    }
    for (; uVar20 != uVar18; uVar20 = uVar20 + 1) {
      plVar1 = labels + uVar20;
      mark(&local_c8,(uint32_t)labels[uVar20].val,labels[uVar20].type);
      uVar3 = labels[uVar20].val;
      if ((((local_c8._48_8_ & 0xffffffff) <= uVar3) &&
          (uVar3 < local_c8.codebase + local_c8.codesz)) && (plVar1->name != (char *)0x0)) {
        local_c8.names[uVar3 - (local_c8._48_8_ & 0xffffffff)] = plVar1->name;
      }
      uVar6 = plVar1->size;
      if (uVar6 != 0) {
        for (uVar11 = 0; uVar11 < uVar6; uVar11 = uVar11 + 4) {
          mark(&local_c8,(int)plVar1->val + uVar11,plVar1->type);
          uVar6 = plVar1->size;
        }
      }
    }
    uVar6 = 0;
    uVar18 = 0;
    bVar21 = true;
LAB_0016ef89:
    do {
      bVar22 = bVar21;
      bVar21 = uVar6 == 0;
      uVar18 = (ulong)(int)uVar18;
      while( true ) {
        iVar19 = (int)uVar18;
        if (num <= iVar19) goto LAB_0016efce;
        uVar11 = iVar19 >> 0x1f;
        if (!bVar21) break;
        iVar7 = (int)((long)((ulong)uVar11 << 0x20 | uVar18 & 0xffffffff) / (long)isa->posunit);
        uVar6 = local_c8.marks[iVar7];
        if ((char)((uVar6 & 8) >> 3) == '\0' && (uVar6 & 3) != 0) {
          local_c8.marks[iVar7] = uVar6 | 8;
          bVar22 = false;
          break;
        }
        uVar18 = uVar18 + 1;
        bVar21 = true;
      }
      a[0] = 0;
      a[1] = 0;
      m[0] = 0;
      m[1] = 0;
      bVar5 = 0;
      lVar14 = 0;
      for (uVar20 = uVar18; (lVar14 != 0x10 && ((long)uVar20 < (long)num)); uVar20 = uVar20 + 1) {
        puVar2 = (ulong *)((long)a + (ulong)((uint)lVar14 & 0xfffffff8));
        *puVar2 = *puVar2 | (ulong)code[uVar20] << (bVar5 & 0x38);
        lVar14 = lVar14 + 1;
        bVar5 = bVar5 + 8;
      }
      local_c8._64_8_ =
           (ulong)((int)((long)((ulong)uVar11 << 0x20 | uVar18 & 0xffffffff) / (long)isa->posunit) +
                  start) << 0x20;
      local_c8._120_8_ = local_c8._120_8_ & 0xffffffff00000000;
      atomtab(&local_c8,a,m,isa->troot,0);
      bVar21 = bVar22;
      if ((local_c8.oplen == 0) || (local_c8.endmark != 0)) {
        uVar6 = 0;
      }
      else {
        uVar6 = (local_c8.marks
                 [(int)((long)((ulong)uVar11 << 0x20 | uVar18 & 0xffffffff) / (long)isa->posunit)] &
                4U) >> 2 ^ 1;
        iVar7 = local_c8.oplen;
        if ((local_c8.marks
             [(int)((long)((ulong)uVar11 << 0x20 | uVar18 & 0xffffffff) / (long)isa->posunit)] & 4U)
            != 0) {
          iVar7 = 0;
        }
        uVar18 = (ulong)(uint)(iVar7 + iVar19);
      }
    } while( true );
  }
  for (iVar19 = 0; iVar19 < num; iVar19 = iVar19 + local_c8.oplen + (uint)(local_c8.oplen == 0)) {
    a[0] = 0;
    a[1] = 0;
    m[0] = 0;
    m[1] = 0;
    bVar5 = 0;
    for (lVar14 = 0; (lVar14 != 0x10 && (iVar19 + lVar14 < (long)num)); lVar14 = lVar14 + 1) {
      puVar2 = (ulong *)((long)a + (ulong)((uint)lVar14 & 0xfffffff8));
      *puVar2 = *puVar2 | (ulong)code[lVar14 + iVar19] << (bVar5 & 0x38);
      bVar5 = bVar5 + 8;
    }
    local_c8._64_8_ = (ulong)(iVar19 / isa->posunit + start) << 0x20;
    atomtab(&local_c8,a,m,isa->troot,0);
  }
LAB_0016f180:
  local_118 = (long)num;
  local_40 = code + -1;
  bVar22 = false;
  uVar18 = 0;
  bVar21 = false;
  iVar19 = 0;
LAB_0016f1ab:
  do {
    while( true ) {
      if (num <= iVar19) {
        free(local_c8.marks);
        return;
      }
      iVar7 = iVar19 / isa->posunit;
      lVar14 = (long)iVar19;
      if (iVar19 % isa->posunit != 0) break;
      uVar6 = local_c8.marks[iVar7];
      if (local_c8.names[iVar7] == (char *)0x0) {
        if ((uVar6 & 0x30) == 0) goto LAB_0016f457;
        if ((int)uVar18 != 0) {
          if (bVar21) {
            pcVar16 = "%s[%x bytes skipped]\n";
            pcVar15 = cunk;
          }
          else {
            pcVar16 = "%s[%x zero bytes skipped]\n";
            pcVar15 = cnorm;
          }
          bVar21 = false;
          fprintf((FILE *)out,pcVar16,pcVar15,uVar18);
        }
      }
      else {
        if ((int)uVar18 != 0) {
          pcVar15 = "%s[%x bytes skipped]\n";
          if (!bVar21) {
            pcVar15 = "%s[%x zero bytes skipped]\n";
          }
          ppcVar8 = &cunk;
          if (!bVar21) {
            ppcVar8 = &cnorm;
          }
          bVar21 = false;
          fprintf((FILE *)out,pcVar15,*ppcVar8,uVar18);
        }
        if ((uVar6 & 0x30) == 0) {
          if ((uVar6 & 2) == 0) {
            pcVar15 = local_c8.names[iVar19 / isa->posunit];
            pcVar16 = cbtarg;
            if ((uVar6 & 1) == 0) {
              pcVar16 = cnorm;
            }
            __format = "%s%s:\n";
          }
          else {
            pcVar15 = local_c8.names[iVar19 / isa->posunit];
            __format = "\n%s%s:\n";
            pcVar16 = cctarg;
          }
          fprintf((FILE *)out,__format,pcVar16,pcVar15);
          uVar18 = 0;
          goto LAB_0016f457;
        }
        fprintf((FILE *)out,"%s%s:\n",cnorm,local_c8.names[iVar19 / isa->posunit]);
      }
      fprintf((FILE *)out,"%s%08x:%s",cnum);
      if ((uVar6 & 0x10) == 0) {
        fprintf((FILE *)out," %s\"",cmem);
        pbVar10 = code + iVar19;
        do {
          iVar19 = iVar19 + 1;
          bVar5 = *pbVar10;
          if (bVar5 == 10) {
            pcVar15 = "\\n";
LAB_0016f352:
            fwrite(pcVar15,2,1,(FILE *)out);
          }
          else {
            if (bVar5 == 0x22) {
              pcVar15 = "\\\"";
              goto LAB_0016f352;
            }
            uVar6 = (uint)bVar5;
            if (uVar6 == 0x5c) {
              pcVar15 = "\\\\";
              goto LAB_0016f352;
            }
            if (uVar6 == 0) goto LAB_0016f392;
            fputc(uVar6,(FILE *)out);
          }
          pbVar10 = pbVar10 + 1;
        } while( true );
      }
      lVar9 = 0;
      for (; (lVar9 != 0x20 && (lVar14 < local_118)); lVar14 = lVar14 + 1) {
        lVar9 = lVar9 + 8;
      }
      fprintf((FILE *)out," %s%08x\n",cmem);
      uVar18 = 0;
      iVar19 = iVar19 + (int)(4 / (long)isa->posunit);
    }
    uVar6 = 0;
LAB_0016f457:
    bVar23 = !bVar22;
    bVar22 = true;
    if (bVar23) {
      bVar22 = (uVar6 & 7) != 0;
      if ((labels != (label *)0x0) && ((uVar6 & 7) == 0)) {
        if (code[lVar14] != '\0') {
          bVar21 = true;
        }
        iVar19 = iVar19 + 1;
        uVar18 = (ulong)((int)uVar18 + 1);
        bVar22 = false;
        goto LAB_0016f1ab;
      }
    }
    if ((int)uVar18 != 0) {
      pcVar15 = "%s[%x bytes skipped]\n";
      if (!bVar21) {
        pcVar15 = "%s[%x zero bytes skipped]\n";
      }
      ppcVar8 = &cunk;
      if (!bVar21) {
        ppcVar8 = &cnorm;
      }
      bVar21 = false;
      fprintf((FILE *)out,pcVar15,*ppcVar8,uVar18);
    }
    a[0] = 0;
    a[1] = 0;
    m[0] = 0;
    m[1] = 0;
    bVar5 = 0;
    for (lVar9 = 0; (lVar9 != 0x10 && (lVar14 + lVar9 < local_118)); lVar9 = lVar9 + 1) {
      puVar2 = (ulong *)((long)a + (ulong)((uint)lVar9 & 0xfffffff8));
      *puVar2 = *puVar2 | (ulong)code[lVar9 + lVar14] << (bVar5 & 0x38);
      bVar5 = bVar5 + 8;
    }
    local_c8._64_8_ = (ulong)(iVar19 / isa->posunit + start) << 0x20;
    local_c8._112_8_ = local_c8._112_8_ & 0xffffffff00000000;
    local_c8._120_8_ = local_c8._120_8_ & 0xffffffff00000000;
    atomtab(&local_c8,a,m,isa->troot,0);
    if ((uVar6 & 4) != 0 || local_c8.endmark != 0) {
      bVar22 = false;
    }
    if (((uVar6 & 2) != 0) && (local_c8.names[iVar19 / isa->posunit] == (char *)0x0)) {
      fputc(10,(FILE *)out);
    }
    ppcVar8 = &cbtarg;
    switch(uVar6 & 3) {
    case 0:
      if (quiet != 0) goto LAB_0016f683;
      fprintf((FILE *)out,"%s%08x:%s",cnorm,(ulong)(start + iVar19 / isa->posunit));
      goto LAB_0016f6a9;
    case 2:
      ppcVar8 = &cctarg;
      break;
    case 3:
      ppcVar8 = &cbctarg;
    }
    fprintf((FILE *)out,"%s%08x:%s",*ppcVar8,(ulong)(start + iVar19 / isa->posunit));
    if (quiet == 0) {
LAB_0016f6a9:
      uVar18 = 0;
      while (iVar7 = (int)uVar18, iVar7 < isa->maxoplen) {
        fputc(0x20,(FILE *)out);
        puVar4 = local_40;
        local_38 = uVar18;
        for (lVar14 = (long)isa->opunit; 0 < lVar14; lVar14 = lVar14 + -1) {
          lVar9 = (long)iVar7 + -1 + lVar14;
          if ((lVar9 == 0) || (lVar9 < local_c8.oplen)) {
            if ((long)(iVar7 + iVar19) + -1 + lVar14 < local_118) {
              fprintf((FILE *)out,"%s%02x",cnorm,(ulong)puVar4[lVar14 + (iVar7 + iVar19)]);
            }
            else {
              fprintf((FILE *)out,"%s??",cunk);
            }
          }
          else {
            fwrite("  ",2,1,(FILE *)out);
          }
        }
        uVar18 = (ulong)(uint)((int)local_38 + isa->opunit);
      }
      fwrite("  ",2,1,(FILE *)out);
      if ((uVar6 & 2) == 0) {
        fputc(0x20,(FILE *)out);
      }
      else {
        fprintf((FILE *)out,"%sC",cctarg);
      }
      if ((uVar6 & 1) == 0) {
        fputc(0x20,(FILE *)out);
        bVar5 = 0;
      }
      else {
        bVar5 = 0;
        fprintf((FILE *)out,"%sB",cbtarg);
      }
    }
    else {
LAB_0016f683:
      bVar5 = 1;
      if ((quiet == 1) && (uVar6 != 0)) {
        fputc(10,(FILE *)out);
      }
    }
    bVar23 = false;
    for (lVar14 = 0; lVar14 < local_c8.atomsnum; lVar14 = lVar14 + 1) {
      expr = local_c8.atoms[lVar14];
      if ((!(bool)(lVar14 == 0 & bVar5) && !bVar23) && expr->type != EXPR_SEEND) {
        fputc(0x20,(FILE *)out);
        expr = local_c8.atoms[lVar14];
      }
      printexpr(out,expr,0);
      bVar23 = local_c8.atoms[lVar14]->type == EXPR_SESTART;
    }
    iVar7 = local_c8.oplen;
    if (local_c8.oplen == 0) {
      fprintf((FILE *)out," %s[unknown op length]%s",cunk);
      iVar7 = 1;
    }
    else {
      iVar17 = local_c8.oplen * 8;
      for (iVar13 = local_c8.oplen; iVar13 < 0x10; iVar13 = iVar13 + 1) {
        a[iVar13 / 8] = a[iVar13 / 8] & ~(0xffL << ((byte)iVar17 & 0x38));
        iVar17 = iVar17 + 8;
      }
      bVar23 = false;
      for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
        puVar2 = a + lVar14;
        *puVar2 = *puVar2 & ~m[lVar14];
        if (*puVar2 != 0) {
          bVar23 = true;
        }
      }
      if (bVar23) {
        fprintf((FILE *)out," %s[unknown:",cunk);
        for (iVar7 = 0; (iVar7 == 0 || (iVar7 < local_c8.oplen)); iVar7 = iVar7 + isa->opunit) {
          fputc(0x20,(FILE *)out);
          iVar17 = (iVar7 + isa->opunit + -1) * 8;
          iVar13 = isa->opunit;
          while (iVar12 = iVar13 + -1, 0 < iVar13) {
            if (iVar19 + iVar7 + iVar12 < num) {
              fprintf((FILE *)out,"%02llx",a[(iVar7 + iVar12) / 8] >> ((byte)iVar17 & 0x38) & 0xff);
            }
            else {
              fwrite("??",2,1,(FILE *)out);
            }
            iVar17 = iVar17 + -8;
            iVar13 = iVar12;
          }
        }
        fputc(0x5d,(FILE *)out);
        iVar7 = local_c8.oplen;
      }
      if (num < iVar7 + iVar19) {
        fprintf((FILE *)out," %s[incomplete]%s",cunk);
        iVar7 = local_c8.oplen;
      }
    }
    iVar19 = iVar7 + iVar19;
    fprintf((FILE *)out,"%s\n",cnorm);
    uVar18 = 0;
  } while( true );
LAB_0016efce:
  uVar6 = 0;
  uVar18 = 0;
  bVar21 = true;
  if (bVar22) goto LAB_0016f180;
  goto LAB_0016ef89;
LAB_0016f392:
  fwrite("\"\n",2,1,(FILE *)out);
  uVar18 = 0;
  goto LAB_0016f1ab;
}

Assistant:

void envydis (const struct disisa *isa, FILE *out, uint8_t *code, uint32_t start, int num, int vartype, int ptype, int quiet, struct label *labels, int labelsnum)
{
	struct disctx c = { 0 };
	struct disctx *ctx = &c;
	int cur = 0, i, j;
	ctx->code8 = code;
	ctx->marks = calloc((num + isa->posunit - 1) / isa->posunit, sizeof *ctx->marks);
	ctx->names = calloc((num + isa->posunit - 1) / isa->posunit, sizeof *ctx->names);
	ctx->codebase = start;
	ctx->codesz = num;
	ctx->vartype = vartype;
	ctx->ptype = ptype;
	ctx->isa = isa;
	ctx->labels = labels;
	ctx->labelsnum = labelsnum;
	if (labels) {
		for (i = 0; i < labelsnum; i++) {
			mark(ctx, labels[i].val, labels[i].type);
			if (labels[i].val >= ctx->codebase && labels[i].val < ctx->codebase + ctx->codesz) {
				if (labels[i].name)
					ctx->names[labels[i].val - ctx->codebase] = labels[i].name;
			}
			if (labels[i].size) {
				for (j = 0; j < labels[i].size; j+=4)
					mark(ctx, labels[i].val + j, labels[i].type);
			}
		}
		int done;
		do {
			done = 1;
			cur = 0;
			int active = 0;
			while (cur < num) {
				if (!active && (ctx->marks[cur / isa->posunit] & 3) && !(ctx->marks[cur / isa->posunit] & 8)) {
					done = 0;
					active = 1;
					ctx->marks[cur / isa->posunit] |= 8;
				}
				if (active) {
					ull a[MAXOPLEN] = {0}, m[MAXOPLEN] = {0};
					for (i = 0; i < MAXOPLEN*8 && cur + i < num; i++) {
						a[i/8] |= (ull)code[cur + i] << (i&7)*8;
					}
					ctx->oplen = 0;
					ctx->pos = cur / isa->posunit + start;
					ctx->endmark = 0;
					atomtab (ctx, a, m, isa->troot, 0);
					if (ctx->oplen && !ctx->endmark && !(ctx->marks[cur / isa->posunit] & 4))
						cur += ctx->oplen;
					else
						active = 0;
				} else {
					cur++;
				}
			}
		} while (!done);
	} else {
		while (cur < num) {
			ull a[MAXOPLEN] = {0}, m[MAXOPLEN] = {0};
			for (i = 0; i < MAXOPLEN*8 && cur + i < num; i++) {
				a[i/8] |= (ull)code[cur + i] << (i&7)*8;
			}
			ctx->oplen = 0;
			ctx->pos = cur / isa->posunit + start;
			atomtab (ctx, a, m, isa->troot, 0);
			if (ctx->oplen)
				cur += ctx->oplen;
			else
				cur++;
		}
	}
	cur = 0;
	int active = 0;
	int skip = 0, nonzero = 0;
	while (cur < num) {
		int mark = (cur % isa->posunit ? 0 : ctx->marks[cur / isa->posunit]);
		if (!(cur % isa->posunit) && ctx->names[cur / isa->posunit]) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cunk, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cnorm, skip);
				skip = 0;
				nonzero = 0;
			}
			if (mark & 0x30)
				fprintf (out, "%s%s:\n", cnorm, ctx->names[cur / isa->posunit]);
			else if (mark & 2)
				fprintf (out, "\n%s%s:\n", cctarg, ctx->names[cur / isa->posunit]);
			else if (mark & 1)
				fprintf (out, "%s%s:\n", cbtarg, ctx->names[cur / isa->posunit]);
			else
				fprintf (out, "%s%s:\n", cnorm, ctx->names[cur / isa->posunit]);
		}
		if (mark & 0x30) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cunk, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cnorm, skip);
				skip = 0;
				nonzero = 0;
			}
			fprintf (out, "%s%08x:%s", cnum, cur / isa->posunit + start, cnorm);
			if (mark & 0x10) {
				uint32_t val = 0;
				for (i = 0; i < 4 && cur + i < num; i++) {
					val |= code[cur + i] << i*8;
				}
				fprintf (out, " %s%08x\n", cmem, val);
				cur += 4 / isa->posunit;
			} else {
				fprintf (out, " %s\"", cmem);
				while (code[cur]) {
					switch (code[cur]) {
						case '\n':
							fprintf (out, "\\n");
							break;
						case '\\':
							fprintf (out, "\\\\");
							break;
						case '\"':
							fprintf (out, "\\\"");
							break;
						default:
							fprintf (out, "%c", code[cur]);
							break;
					}
					cur++;
				}
				cur++;
				fprintf (out, "\"\n");
			}
			continue;
		}
		if (!active && mark & 7)
			active = 1;
		if (!active && labels) {
			if (code[cur])
				nonzero = 1;
			cur++;
			skip++;
			continue;
		}
		if (skip) {
			if (nonzero)
				fprintf(out, "%s[%x bytes skipped]\n", cunk, skip);
			else
				fprintf(out, "%s[%x zero bytes skipped]\n", cnorm, skip);
			skip = 0;
			nonzero = 0;
		}
		ull a[MAXOPLEN] = {0}, m[MAXOPLEN] = {0};
		for (i = 0; i < MAXOPLEN*8 && cur + i < num; i++) {
			a[i/8] |= (ull)code[cur + i] << (i&7)*8;
		}
		ctx->oplen = 0;
		ctx->pos = cur / isa->posunit + start;
		ctx->atomsnum = 0;
		ctx->endmark = 0;
		atomtab (ctx, a, m, isa->troot, 0);

		if (ctx->endmark || mark & 4)
			active = 0;

		if (mark & 2 && !ctx->names[cur / isa->posunit])
			fprintf (out, "\n");
		switch (mark & 3) {
			case 0:
				if (!quiet)
					fprintf (out, "%s%08x:%s", cnorm, cur / isa->posunit + start, cnorm);
				break;
			case 1:
				fprintf (out, "%s%08x:%s", cbtarg, cur / isa->posunit + start, cnorm);
				break;
			case 2:
				fprintf (out, "%s%08x:%s", cctarg, cur / isa->posunit + start, cnorm);
				break;
			case 3:
				fprintf (out, "%s%08x:%s", cbctarg, cur / isa->posunit + start, cnorm);
				break;
		}

		if (!quiet) {
			for (i = 0; i < isa->maxoplen; i += isa->opunit) {
				fprintf (out, " ");
				for (j = isa->opunit - 1; j >= 0; j--)
					if (i+j && i+j >= ctx->oplen)
						fprintf (out, "  ");
					else if (cur+i+j >= num)
						fprintf (out, "%s??", cunk);
					else
						fprintf (out, "%s%02x", cnorm, code[cur + i + j]);
			}
			fprintf (out, "  ");

			if (mark & 2)
				fprintf (out, "%sC", cctarg);
			else
				fprintf (out, " ");
			if (mark & 1)
				fprintf (out, "%sB", cbtarg);
			else
				fprintf (out, " ");
		} else if (quiet == 1) {
			if (mark)
				fprintf (out, "\n");
		}

		int noblank = 0;

		for (i = 0; i < ctx->atomsnum; i++) {
			if (ctx->atoms[i]->type == EXPR_SEEND)
				noblank = 1;
			if ((i || !quiet) && !noblank)
				fprintf (out, " ");
			printexpr(out, ctx->atoms[i], 0);
			noblank = (ctx->atoms[i]->type == EXPR_SESTART);
		}

		if (ctx->oplen) {
			int fl = 0;
			for (i = ctx->oplen; i < MAXOPLEN * 8; i++)
				a[i/8] &= ~(0xffull << (i & 7) * 8);
			for (i = 0; i < MAXOPLEN; i++) {
				a[i] &= ~m[i];
				if (a[i])
					fl = 1;
			}
			if (fl) {
				fprintf (out, " %s[unknown:", cunk);
				for (i = 0; i < ctx->oplen || i == 0; i += isa->opunit) {
					fprintf (out, " ");
					for (j = isa->opunit - 1; j >= 0; j--)
						if (cur+i+j >= num)
							fprintf (out, "??");
						else
							fprintf (out, "%02llx", (a[(i+j)/8] >> ((i + j)&7) * 8) & 0xff);
				}
				fprintf (out, "]");
			}
			if (cur + ctx->oplen > num) {
				fprintf (out, " %s[incomplete]%s", cunk, cnorm);
			}
			cur += ctx->oplen;
		} else {
			fprintf (out, " %s[unknown op length]%s", cunk, cnorm);
			cur++;
		}
		fprintf (out, "%s\n", cnorm);
	}
	free(ctx->marks);
}